

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O1

void __thiscall ktx::Tools::printUsage(Tools *this,ostream *os,Options *options)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  pointer local_28;
  size_type sStack_20;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cxxopts::Options::help(&local_68,options,&local_48,true);
  local_28 = local_68._M_dataplus._M_p;
  sStack_20 = local_68._M_string_length;
  format_str.size_ = 2;
  format_str.data_ = "{}";
  args.field_1.values_ =
       (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_28;
  args.desc_ = 0xd;
  ::fmt::v10::vprint<char>(os,format_str,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  format_str_00.size_ = 1;
  format_str_00.data_ = "\n";
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_00,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar1 << 0x40));
  format_str_01.size_ = 0x14;
  format_str_01.data_ = "Available commands:\n";
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_01,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar2 << 0x40));
  format_str_02.size_ = 0x39;
  format_str_02.data_ = "  create     Create a KTX2 file from various input files\n";
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_02,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar3 << 0x40));
  format_str_03.size_ = 0x31;
  format_str_03.data_ = "  deflate    Deflate (supercompress) a KTX2 file\n";
  auVar4._8_8_ = 0;
  auVar4._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_03,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar4 << 0x40));
  format_str_04.size_ = 0x36;
  format_str_04.data_ = "  extract    Extract selected images from a KTX2 file\n";
  auVar5._8_8_ = 0;
  auVar5._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_04,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar5 << 0x40));
  format_str_05.size_ = 0x20;
  format_str_05.data_ = "  encode     Encode a KTX2 file\n";
  auVar6._8_8_ = 0;
  auVar6._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_05,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar6 << 0x40));
  format_str_06.size_ = 0x23;
  format_str_06.data_ = "  transcode  Transcode a KTX2 file\n";
  auVar7._8_8_ = 0;
  auVar7._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_06,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar7 << 0x40));
  format_str_07.size_ = 0x31;
  format_str_07.data_ = "  info       Print information about a KTX2 file\n";
  auVar8._8_8_ = 0;
  auVar8._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_07,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar8 << 0x40));
  format_str_08.size_ = 0x22;
  format_str_08.data_ = "  validate   Validate a KTX2 file\n";
  auVar9._8_8_ = 0;
  auVar9._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_08,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar9 << 0x40));
  format_str_09.size_ = 0x24;
  format_str_09.data_ = "  compare    Compare two KTX2 files\n";
  auVar10._8_8_ = 0;
  auVar10._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_09,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar10 << 0x40));
  format_str_10.size_ = 0x39;
  format_str_10.data_ = "  help       Display help information about the ktx tool\n";
  auVar11._8_8_ = 0;
  auVar11._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_10,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar11 << 0x40));
  format_str_11.size_ = 1;
  format_str_11.data_ = "\n";
  auVar12._8_8_ = 0;
  auVar12._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_11,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar12 << 0x40));
  format_str_12.size_ = 0x69;
  format_str_12.data_ =
       "For detailed usage and description of each subcommand use \'ktx help <command>\'\nor \'ktx <command> --help\'\n"
  ;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = &local_68;
  ::fmt::v10::vprint<char>
            (os,format_str_12,
             (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>)
             (auVar13 << 0x40));
  return;
}

Assistant:

void Tools::printUsage(std::ostream& os, const cxxopts::Options& options) {
    fmt::print(os, "{}", options.help());

    fmt::print(os, "\n");
    fmt::print(os, "Available commands:\n");
    fmt::print(os, "  create     Create a KTX2 file from various input files\n");
    fmt::print(os, "  deflate    Deflate (supercompress) a KTX2 file\n");
    fmt::print(os, "  extract    Extract selected images from a KTX2 file\n");
    fmt::print(os, "  encode     Encode a KTX2 file\n");
    fmt::print(os, "  transcode  Transcode a KTX2 file\n");
    fmt::print(os, "  info       Print information about a KTX2 file\n");
    fmt::print(os, "  validate   Validate a KTX2 file\n");
    fmt::print(os, "  compare    Compare two KTX2 files\n");
    fmt::print(os, "  help       Display help information about the ktx tool\n");
#if KTX_DEVELOPER_FEATURE_PATCH
    fmt::print(os, "  patch      Apple certain patch operations to a KTX2 file.");
#endif
    fmt::print(os, "\n");
    fmt::print(os, "For detailed usage and description of each subcommand use 'ktx help <command>'\n"
                   "or 'ktx <command> --help'\n");
}